

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::~AddressFactory_GetAddressByLockingScript_Test
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}